

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O0

Vec_Ptr_t * Hop_ManDfs(Hop_Man_t *p)

{
  int nCap;
  Vec_Ptr_t *vNodes_00;
  int local_24;
  int i;
  Hop_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Hop_Man_t *p_local;
  
  nCap = Hop_ManNodeNum(p);
  vNodes_00 = Vec_PtrAlloc(nCap);
  for (local_24 = 0; local_24 < p->nTableSize; local_24 = local_24 + 1) {
    if (p->pTable[local_24] != (Hop_Obj_t *)0x0) {
      Hop_ManDfs_rec(p->pTable[local_24],vNodes_00);
    }
  }
  for (local_24 = 0; local_24 < p->nTableSize; local_24 = local_24 + 1) {
    if (p->pTable[local_24] != (Hop_Obj_t *)0x0) {
      Hop_ObjClearMarkA(p->pTable[local_24]);
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Hop_ManDfs( Hop_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Hop_Obj_t * pObj;
    int i;
    vNodes = Vec_PtrAlloc( Hop_ManNodeNum(p) );
    Hop_ManForEachNode( p, pObj, i )
        Hop_ManDfs_rec( pObj, vNodes );
    Hop_ManForEachNode( p, pObj, i )
        Hop_ObjClearMarkA(pObj);
    return vNodes;
}